

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

int __thiscall
glcts::BlendEquationSeparateCase::init(BlendEquationSeparateCase *this,EVP_PKEY_CTX *ctx)

{
  ModeCase *this_00;
  BlendEquationSeparateCase *pBVar1;
  uint local_14;
  int i;
  BlendEquationSeparateCase *this_local;
  
  local_14 = 0;
  pBVar1 = this;
  while ((int)local_14 < 0xf) {
    this_00 = (ModeCase *)operator_new(0x80);
    ModeCase::ModeCase(this_00,(this->super_TestCaseGroup).m_context,
                       *(GLenum *)(s_modes + (long)(int)local_14 * 4));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_14 = local_14 + 1;
    pBVar1 = (BlendEquationSeparateCase *)(ulong)local_14;
  }
  return (int)pBVar1;
}

Assistant:

void init(void)
	{
		// Pump individual modes.
		for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_modes); i++)
			addChild(new ModeCase(m_context, s_modes[i]));
	}